

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O0

void av1_fwd_txfm2d_32x16_sse4_1(int16_t *input,int32_t *coeff,int stride,TX_TYPE tx_type,int bd)

{
  int iVar1;
  int iVar2;
  int fliplr;
  int shift_00;
  byte in_CL;
  __m128i *in_RSI;
  int i;
  int bitrow;
  int bitcol;
  fwd_transform_1d_sse4_1 row_txfm;
  fwd_transform_1d_sse4_1 col_txfm;
  int txh_idx;
  int txw_idx;
  int8_t *shift;
  __m128i *outcoef128;
  __m128i in [128];
  int in_stack_fffffffffffff79c;
  undefined4 in_stack_fffffffffffff7a0;
  undefined4 in_stack_fffffffffffff7a4;
  fwd_transform_1d_sse4_1 p_Var3;
  __m128i *out;
  longlong local_828 [6];
  int in_stack_fffffffffffff80c;
  int in_stack_fffffffffffff810;
  int in_stack_fffffffffffff814;
  __m128i *in_stack_fffffffffffff818;
  __m128i *in_stack_fffffffffffff820;
  
  iVar1 = get_txw_idx('\n');
  iVar2 = get_txh_idx('\n');
  out = (__m128i *)row_highbd_txfm8x32_arr[in_CL];
  p_Var3 = col_highbd_txfm8x32_arr[in_CL];
  fliplr = (int)av1_fwd_cos_bit_col[iVar1][iVar2];
  shift_00 = (int)av1_fwd_cos_bit_row[iVar1][iVar2];
  load_buffer_32x8n((int16_t *)CONCAT44(iVar1,iVar2),out,(int)((ulong)p_Var3 >> 0x20),(int)p_Var3,
                    fliplr,shift_00,(int)in_RSI);
  (*(code *)out)(local_828,local_828,fliplr,8);
  col_txfm_16x16_rounding
            ((__m128i *)CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0),
             in_stack_fffffffffffff79c);
  col_txfm_16x16_rounding
            ((__m128i *)CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0),
             in_stack_fffffffffffff79c);
  transpose_8nx8n((__m128i *)local_828,in_RSI,0x20,0x10);
  for (iVar1 = 0; iVar1 < 4; iVar1 = iVar1 + 1) {
    (*p_Var3)(in_RSI + iVar1,(__m128i *)(local_828 + (long)iVar1 * 2),shift_00,4);
  }
  av1_round_shift_rect_array_32_sse4_1
            (in_stack_fffffffffffff820,in_stack_fffffffffffff818,in_stack_fffffffffffff814,
             in_stack_fffffffffffff810,in_stack_fffffffffffff80c);
  return;
}

Assistant:

void av1_fwd_txfm2d_32x16_sse4_1(const int16_t *input, int32_t *coeff,
                                 int stride, TX_TYPE tx_type, int bd) {
  __m128i in[128];
  __m128i *outcoef128 = (__m128i *)coeff;
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_32X16];
  const int txw_idx = get_txw_idx(TX_32X16);
  const int txh_idx = get_txh_idx(TX_32X16);
  const fwd_transform_1d_sse4_1 col_txfm = row_highbd_txfm8x32_arr[tx_type];
  const fwd_transform_1d_sse4_1 row_txfm = col_highbd_txfm8x32_arr[tx_type];
  int bitcol = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  int bitrow = av1_fwd_cos_bit_row[txw_idx][txh_idx];

  // column transform
  load_buffer_32x8n(input, in, stride, 0, 0, shift[0], 16);
  col_txfm(in, in, bitcol, 8);
  col_txfm_16x16_rounding(&in[0], -shift[1]);
  col_txfm_16x16_rounding(&in[64], -shift[1]);
  transpose_8nx8n(in, outcoef128, 32, 16);

  // row transform
  for (int i = 0; i < 4; i++) {
    row_txfm((outcoef128 + i), (in + i), bitrow, 4);
  }
  av1_round_shift_rect_array_32_sse4_1(in, outcoef128, 128, -shift[2],
                                       NewSqrt2);
  (void)bd;
}